

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool google::protobuf::FileOptions::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),(MessageLite *)_FileOptions_default_instance_);
  if (((bVar1) &&
      (bVar1 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                         ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)(msg + 3)),
      bVar1)) &&
     (((msg[2]._internal_metadata_.ptr_ & 0x400) == 0 ||
      (bVar1 = FeatureSet::IsInitializedImpl((MessageLite *)msg[9]._internal_metadata_.ptr_), bVar1)
      ))) {
    return true;
  }
  return false;
}

Assistant:

PROTOBUF_NOINLINE bool FileOptions::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FileOptions&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_uninterpreted_option()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000400u) != 0) {
    if (!this_._impl_.features_->IsInitialized()) return false;
  }
  return true;
}